

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

bool __thiscall
soul::
Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>::
parseBinaryLiteral(Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
                   *this)

{
  bool bVar1;
  anon_class_1_0_00000001 local_29;
  UTF8Reader local_28;
  UTF8Reader local_20;
  UTF8Reader t;
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  *this_local;
  
  t.data = (char *)this;
  UTF8Reader::UTF8Reader(&local_20,&this->input);
  bVar1 = UTF8Reader::advanceIfStartsWith<char_const*>(&local_20,"0b","0B");
  if (bVar1) {
    UTF8Reader::UTF8Reader(&local_28,&local_20);
    this_local._7_1_ =
         Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
         ::
         parseIntegerWithBase<2,soul::Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>::parseBinaryLiteral()::_lambda(unsigned_int)_1_>
                   ((Tokeniser<soul::Keyword::Matcher,soul::StandardOperatorMatcher,soul::StandardIdentifierMatcher>
                     *)this,&local_28,&local_29);
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool parseBinaryLiteral()
    {
        auto t = input;

        if (t.advanceIfStartsWith ("0b", "0B"))
            return parseIntegerWithBase<2> (t, [] (UnicodeChar c) -> int { return c == '0' ? 0 : (c == '1' ? 1 : -1); });

        return false;
    }